

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

int __thiscall duckdb_re2::RE2::Options::ParseFlags(Options *this)

{
  uint uVar1;
  uint uVar2;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  uVar2 = 4;
  if (this->encoding_ != EncodingUTF8) {
    if (this->encoding_ == EncodingLatin1) {
      uVar2 = 0x24;
    }
    else if (this->log_errors_ == true) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Unknown encoding ",0x11);
      std::ostream::operator<<(local_190,this->encoding_);
      std::__cxx11::ostringstream::~ostringstream(local_190);
      std::ios_base::~ios_base(local_120);
    }
  }
  uVar1 = uVar2 | 0x794;
  if (this->posix_syntax_ != false) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 | 2;
  if (this->literal_ == false) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 + 0x800;
  if (this->never_nl_ == false) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 | 8;
  if (this->dot_nl_ == false) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 | 0x1000;
  if (this->never_capture_ == false) {
    uVar1 = uVar2;
  }
  uVar1 = this->case_sensitive_ ^ 1 | uVar1;
  uVar2 = uVar1 | 0x80;
  if (this->perl_classes_ == false) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 | 0x100;
  if (this->word_boundary_ == false) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 | 0x10;
  if (this->one_line_ == false) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

int RE2::Options::ParseFlags() const {
  int flags = Regexp::ClassNL;
  switch (encoding()) {
    default:
      if (log_errors())
        LOG(ERROR) << "Unknown encoding " << encoding();
      break;
    case RE2::Options::EncodingUTF8:
      break;
    case RE2::Options::EncodingLatin1:
      flags |= Regexp::Latin1;
      break;
  }

  if (!posix_syntax())
    flags |= Regexp::LikePerl;

  if (literal())
    flags |= Regexp::Literal;

  if (never_nl())
    flags |= Regexp::NeverNL;

  if (dot_nl())
    flags |= Regexp::DotNL;

  if (never_capture())
    flags |= Regexp::NeverCapture;

  if (!case_sensitive())
    flags |= Regexp::FoldCase;

  if (perl_classes())
    flags |= Regexp::PerlClasses;

  if (word_boundary())
    flags |= Regexp::PerlB;

  if (one_line())
    flags |= Regexp::OneLine;

  return flags;
}